

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
split<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *s,char delim,
          function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *transform)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator __position;
  pointer piVar3;
  int iVar4;
  istream *piVar5;
  undefined8 uVar6;
  ulong uVar7;
  pointer pcVar8;
  long lVar9;
  pointer pcVar10;
  pointer pcVar11;
  string item;
  stringstream ss;
  int local_214;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  pointer local_1f0;
  pointer local_1e8;
  string *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar7 = s->_M_string_length;
  pcVar11 = pcVar2 + uVar7;
  lVar9 = (long)uVar7 >> 2;
  pcVar10 = pcVar11;
  local_1e0 = s;
  if (0 < lVar9) {
    local_1f0 = pcVar11 + -(uVar7 & 0xfffffffffffffffc);
    local_1e8 = pcVar11 + lVar9 * -4;
    lVar9 = lVar9 + 1;
    do {
      iVar4 = isspace((int)pcVar2[uVar7 - 1]);
      if (iVar4 == 0) {
        pcVar8 = pcVar2 + uVar7;
        goto LAB_0011597b;
      }
      iVar4 = isspace((int)pcVar2[uVar7 - 2]);
      if (iVar4 == 0) {
        pcVar8 = pcVar2 + (uVar7 - 1);
        goto LAB_0011597b;
      }
      iVar4 = isspace((int)pcVar2[uVar7 - 3]);
      if (iVar4 == 0) {
        pcVar8 = pcVar2 + (uVar7 - 2);
        goto LAB_0011597b;
      }
      iVar4 = isspace((int)pcVar2[uVar7 - 4]);
      if (iVar4 == 0) {
        pcVar8 = pcVar2 + (uVar7 - 3);
        goto LAB_0011597b;
      }
      uVar7 = uVar7 - 4;
      lVar9 = lVar9 + -1;
      pcVar11 = local_1f0;
      pcVar10 = local_1e8;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar11 - (long)pcVar2;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pcVar8 = pcVar2;
      if ((lVar9 != 3) || (iVar4 = isspace((int)pcVar11[-1]), pcVar8 = pcVar11, iVar4 == 0))
      goto LAB_0011597b;
      pcVar11 = pcVar10 + -1;
      pcVar10 = pcVar11;
    }
    iVar4 = isspace((int)pcVar11[-1]);
    pcVar8 = pcVar11;
    if (iVar4 == 0) goto LAB_0011597b;
    pcVar11 = pcVar10 + -1;
  }
  iVar4 = isspace((int)pcVar11[-1]);
  pcVar8 = pcVar11;
  if (iVar4 != 0) {
    pcVar8 = pcVar2;
  }
LAB_0011597b:
  local_1e0->_M_string_length = (long)pcVar8 - (long)pcVar2;
  *pcVar8 = '\0';
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_1e0,_S_out|_S_in);
  local_210 = &local_200;
  local_208 = 0;
  local_200 = 0;
  paVar1 = &local_1d8.field_2;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_210,delim);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      if (local_210 != &local_200) {
        operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_210,local_210 + local_208);
    if ((transform->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    local_214 = (*transform->_M_invoker)((_Any_data *)transform,&local_1d8);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (__return_storage_ptr__,__position,&local_214);
    }
    else {
      *__position._M_current = local_214;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar6 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

std::vector<t> split(std::string& s, char delim, const std::function<t(std::string)>& transform) {
	trim(s);
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)){ elems.push_back(transform(item)); }
	return elems;
}